

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O2

SizeData * __thiscall
Rml::ElementHandleTargetData::GetSizeData
          (SizeData *__return_storage_ptr__,ElementHandleTargetData *this,Vector2f *drag_delta_min,
          Vector2f *drag_delta_max)

{
  undefined8 uVar1;
  ComputedValues *pCVar2;
  ulong uVar3;
  Vector2f VVar4;
  Vector2f VVar5;
  Vector2f b;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_78;
  float fStack_74;
  float local_58;
  float fStack_54;
  
  VVar4 = Box::GetSize(this->box,
                       (uint)((*(uint *)&this->computed->common >> 0x10 & 1) == 0) * 2 + Border);
  __return_storage_ptr__->original_size = VVar4;
  fVar8 = GetPositionRight(this);
  fVar9 = GetPositionBottom(this);
  (__return_storage_ptr__->original_position_bottom_right).x = fVar8;
  (__return_storage_ptr__->original_position_bottom_right).y = fVar9;
  pCVar2 = this->computed;
  uVar3 = *(ulong *)&pCVar2->common;
  bVar6 = (uVar3 >> 0x24 & 3) == 0;
  (__return_storage_ptr__->bottom_right).x = !bVar6;
  bVar7 = (uVar3 >> 0x26 & 3) == 0;
  (__return_storage_ptr__->bottom_right).y = !bVar7;
  (__return_storage_ptr__->width_height).x =
       ((uVar3 & 0x60000) != 0 || (uVar3 & 0x30000000000) == 0) || bVar6;
  (__return_storage_ptr__->width_height).y =
       ((uVar3 & 0x180000) != 0 || (uVar3 & 0xc00000000) == 0) || bVar7;
  fVar8 = ResolveValue((LengthPercentage)
                       (CONCAT44((pCVar2->rare).min_width,*(undefined4 *)&pCVar2->rare) &
                       0xffffffff00000001),(this->containing_block).x);
  fVar9 = ResolveValue((LengthPercentage)
                       (CONCAT44((this->computed->rare).min_height,
                                 *(uint *)&this->computed->rare >> 2) & 0xffffffff00000001),
                       (this->containing_block).y);
  fVar10 = ResolveValueOr((LengthPercentage)
                          (CONCAT44((this->computed->rare).max_width,
                                    *(uint *)&this->computed->rare >> 1) & 0xffffffff00000001),
                          (this->containing_block).x,3.4028235e+38);
  fVar11 = ResolveValueOr((LengthPercentage)
                          (CONCAT44((this->computed->rare).max_height,
                                    *(uint *)&this->computed->rare >> 3) & 0xffffffff00000001),
                          (this->containing_block).y,3.4028235e+38);
  VVar5 = DistanceToTopLeft(this);
  VVar5 = DistanceToBottomRight(this,VVar5);
  local_78 = VVar4.x;
  fStack_74 = VVar4.y;
  VVar4.y = fVar9 - fStack_74;
  VVar4.x = fVar8 - local_78;
  VVar4 = Math::Max<Rml::Vector2<float>>(*drag_delta_min,VVar4);
  *drag_delta_min = VVar4;
  b.y = fVar11 - fStack_74;
  b.x = fVar10 - local_78;
  VVar4 = Math::Min<Rml::Vector2<float>>(*drag_delta_max,b);
  *drag_delta_max = VVar4;
  uVar1 = *(undefined8 *)((this->resolved_edge_margin)._M_elems + 1);
  local_58 = VVar5.x;
  fStack_54 = VVar5.y;
  VVar5.y = fStack_54 - (float)((ulong)uVar1 >> 0x20);
  VVar5.x = local_58 - (float)uVar1;
  VVar4 = Math::Min<Rml::Vector2<float>>(VVar4,VVar5);
  *drag_delta_max = VVar4;
  return __return_storage_ptr__;
}

Assistant:

SizeData GetSizeData(Vector2f& drag_delta_min, Vector2f& drag_delta_max) const
	{
		using namespace Style;
		SizeData data = {};

		data.original_size = box.GetSize(computed.box_sizing() == BoxSizing::BorderBox ? BoxArea::Border : BoxArea::Content);
		data.original_position_bottom_right = {GetPositionRight(), GetPositionBottom()};

		data.bottom_right.x = (computed.right().type != Right::Auto);
		data.bottom_right.y = (computed.bottom().type != Bottom::Auto);
		data.width_height.x = (computed.left().type == Left::Auto || computed.right().type == Right::Auto || computed.width().type != Width::Auto);
		data.width_height.y = (computed.top().type == Top::Auto || computed.bottom().type == Bottom::Auto || computed.height().type != Height::Auto);

		const Vector2f min_size = {
			ResolveValue(computed.min_width(), containing_block.x),
			ResolveValue(computed.min_height(), containing_block.y),
		};
		const Vector2f max_size = {
			ResolveValueOr(computed.max_width(), containing_block.x, FLT_MAX),
			ResolveValueOr(computed.max_height(), containing_block.y, FLT_MAX),
		};
		const Vector2f distance_to_bottom_right = DistanceToBottomRight(DistanceToTopLeft());

		drag_delta_min = Math::Max(drag_delta_min, min_size - data.original_size);
		drag_delta_max = Math::Min(drag_delta_max, max_size - data.original_size);
		drag_delta_max = Math::Min(drag_delta_max, Vector2f{-resolved_edge_margin[RIGHT], -resolved_edge_margin[BOTTOM]} + distance_to_bottom_right);

		return data;
	}